

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

string * __thiscall
argparse::details::
join<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (string *__return_storage_ptr__,details *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          first,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                last,string *separator)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  stringstream value;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this == first._M_current)
  {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,*(char **)this,*(long *)(this + 8))
    ;
    for (pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x20)
        ; pbVar2 != first._M_current; pbVar2 = pbVar2 + 1) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a0,((last._M_current)->_M_dataplus)._M_p,
                          (last._M_current)->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join(StrIt first, StrIt last, const std::string &separator) {
  if (first == last) {
    return "";
  }
  std::stringstream value;
  value << *first;
  ++first;
  while (first != last) {
    value << separator << *first;
    ++first;
  }
  return value.str();
}